

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R10_Decoder.cc
# Opt level: O0

Array_Data_Symbol * __thiscall
R10_Decoder::InactivationDecoding
          (Array_Data_Symbol *__return_storage_ptr__,R10_Decoder *this,
          matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          *A,Array_Data_Symbol *D,uint32_t *M)

{
  Array_Data_Symbol local_b0;
  undefined1 local_31;
  uint32_t *local_30;
  uint32_t *M_local;
  Array_Data_Symbol *D_local;
  matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  *A_local;
  R10_Decoder *this_local;
  Array_Data_Symbol *result;
  
  local_31 = 0;
  local_30 = M;
  M_local = &D->sym_len;
  D_local = (Array_Data_Symbol *)A;
  A_local = (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
             *)this;
  this_local = (R10_Decoder *)__return_storage_ptr__;
  Array_Data_Symbol::Array_Data_Symbol(__return_storage_ptr__);
  this->overhead = *local_30 - this->sym_p->L;
  this->N = this->sym_p->K + this->overhead;
  Indecoding_phase_1(&local_b0,this,
                     (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)D_local,(Array_Data_Symbol *)M_local,local_30);
  Array_Data_Symbol::operator=(__return_storage_ptr__,&local_b0);
  Array_Data_Symbol::~Array_Data_Symbol(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

class Array_Data_Symbol R10_Decoder::InactivationDecoding(matrix<uint8_t> &A, class Array_Data_Symbol &D, uint32_t &M)
{
	//class Array_Data_Symbol _D = D;
	//uint32_t _M = M;
	class Array_Data_Symbol result;


	overhead = M - sym_p->L;
	N = sym_p->K + overhead;
	//std::cout << "M : " << M << "  overhead: " << overhead << "  N: " << N << std::endl;



	result = Indecoding_phase_1(A, D, M);



	return result;
}